

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusion.cpp
# Opt level: O0

RTVector3 __thiscall RTFusion::getAccelResiduals(RTFusion *this)

{
  RTFLOAT *this_00;
  RTFLOAT *this_01;
  RTVector3 *this_02;
  RTVector3 *this_03;
  RTFLOAT RVar1;
  RTFLOAT RVar2;
  RTVector3 RVar3;
  RTQuaternion RVar4;
  RTQuaternion local_80;
  RTQuaternion local_70;
  RTQuaternion local_60;
  undefined1 local_50 [8];
  RTQuaternion qTemp;
  RTQuaternion fusedConjugate;
  RTQuaternion rotatedGravity;
  RTFusion *this_local;
  undefined4 uStack_10;
  RTVector3 residuals;
  undefined8 uVar5;
  
  this_00 = fusedConjugate.m_data + 2;
  RTQuaternion::RTQuaternion((RTQuaternion *)this_00);
  this_01 = qTemp.m_data + 2;
  RTQuaternion::RTQuaternion((RTQuaternion *)this_01);
  RTQuaternion::RTQuaternion((RTQuaternion *)local_50);
  this_02 = (RTVector3 *)((long)&this_local + 4);
  RTVector3::RTVector3(this_02);
  RVar4 = RTQuaternion::conjugate(&this->m_fusionQPose);
  local_60.m_data._0_8_ = RVar4.m_data._0_8_;
  local_60.m_data._8_8_ = RVar4.m_data._8_8_;
  RTQuaternion::operator=((RTQuaternion *)this_01,&local_60);
  RVar4 = RTQuaternion::operator*(&this->m_gravity,&this->m_fusionQPose);
  local_70.m_data._0_8_ = RVar4.m_data._0_8_;
  local_70.m_data._8_8_ = RVar4.m_data._8_8_;
  RTQuaternion::operator=((RTQuaternion *)local_50,&local_70);
  RVar4 = RTQuaternion::operator*((RTQuaternion *)this_01,(RTQuaternion *)local_50);
  local_80.m_data._0_8_ = RVar4.m_data._0_8_;
  local_80.m_data._8_8_ = RVar4.m_data._8_8_;
  RTQuaternion::operator=((RTQuaternion *)this_00,&local_80);
  this_03 = &this->m_accel;
  RVar1 = RTVector3::x(this_03);
  RVar2 = RTQuaternion::x((RTQuaternion *)this_00);
  RTVector3::setX(this_02,-(RVar1 - RVar2));
  RVar1 = RTVector3::y(this_03);
  RVar2 = RTQuaternion::y((RTQuaternion *)this_00);
  RTVector3::setY(this_02,-(RVar1 - RVar2));
  RVar1 = RTVector3::z(this_03);
  RVar2 = RTQuaternion::z((RTQuaternion *)this_00);
  RTVector3::setZ(this_02,-(RVar1 - RVar2));
  RVar3.m_data[0] = (RTFLOAT)this_local._4_4_;
  uVar5._4_4_ = (RTFLOAT)uStack_10;
  RVar3.m_data[2] = residuals.m_data[0];
  return (RTVector3)RVar3.m_data;
}

Assistant:

RTVector3 RTFusion::getAccelResiduals()
{
    RTQuaternion rotatedGravity;
    RTQuaternion fusedConjugate;
    RTQuaternion qTemp;
    RTVector3 residuals;

    //  do gravity rotation and subtraction

    // create the conjugate of the pose

    fusedConjugate = m_fusionQPose.conjugate();

    // now do the rotation - takes two steps with qTemp as the intermediate variable

    qTemp = m_gravity * m_fusionQPose;
    rotatedGravity = fusedConjugate * qTemp;

    // now adjust the measured accel and change the signs to make sense

    residuals.setX(-(m_accel.x() - rotatedGravity.x()));
    residuals.setY(-(m_accel.y() - rotatedGravity.y()));
    residuals.setZ(-(m_accel.z() - rotatedGravity.z()));
    return residuals;
}